

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O2

void __thiscall
toml::
result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
::cleanup(result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
          *this,EVP_PKEY_CTX *ctx)

{
  if (this->is_ok_ == true) {
    detail::region::~region((region *)&(this->field_1).succ_);
    return;
  }
  std::__cxx11::string::~string
            ((string *)
             ((long)&(this->field_1).succ_.value.
                     super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                     .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
                     super__Tuple_impl<2UL,_toml::detail::region>.
                     super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x38));
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)((long)&(this->field_1).succ_.value.
                       super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                       .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
                       super__Tuple_impl<2UL,_toml::detail::region>.
                       super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x20));
  std::__cxx11::string::~string((string *)&(this->field_1).succ_);
  return;
}

Assistant:

void cleanup() noexcept
    {
#if defined(__GNUC__) && ! defined(__clang__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wduplicated-branches"
#endif

        if(this->is_ok_) {this->succ_.~success_type();}
        else             {this->fail_.~failure_type();}

#if defined(__GNUC__) && ! defined(__clang__)
#pragma GCC diagnostic pop
#endif
        return;
    }